

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

double opengv::absolute_pose::modules::gpnp_evaluate
                 (Matrix<double,_12,_1,_0,_12,_1> *solution,points_t *c,translation_t *t,
                 rotation_t *R)

{
  double *pdVar1;
  undefined8 *puVar2;
  pointer pMVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  ActualDstType actualDst;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  points_t ccam;
  transformation_t transformation;
  points_t local_120;
  translation_t *local_100;
  rotation_t *local_f8;
  undefined1 local_f0 [16];
  double local_e0;
  rotation_t *local_d8;
  undefined1 *local_d0 [2];
  transformation_t local_c0;
  
  local_120.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_120.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  lVar7 = 0x10;
  local_100 = t;
  do {
    pdVar1 = (double *)
             ((long)(solution->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).
                    m_storage.m_data.array + lVar7 + -0x10);
    local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = *pdVar1;
    local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = pdVar1[1];
    local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)(solution->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).
                   m_storage.m_data.array + lVar7);
    if (local_120.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_120.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_120,
                 (iterator)
                 local_120.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_c0);
    }
    else {
      ((local_120.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
      ((local_120.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
      ((local_120.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
      local_120.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_120.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x70);
  math::arun_complete(&local_c0,c,&local_120);
  (local_100->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [0] = local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [9];
  (local_100->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [1] = local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [10];
  (local_100->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [0xb];
  lVar7 = 0x10;
  do {
    uVar6 = *(undefined8 *)((long)local_d0 + lVar7 + 8);
    puVar2 = (undefined8 *)
             ((long)(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array + lVar7 + -0x10);
    *puVar2 = *(undefined8 *)((long)local_d0 + lVar7);
    puVar2[1] = uVar6;
    *(undefined8 *)
     ((long)(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
     + lVar7) = *(undefined8 *)
                 ((long)local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                        m_storage.m_data.array + lVar7);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x58);
  pMVar3 = (c->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_d0[0] = local_f0;
  dVar8 = 0.0;
  lVar7 = 0x10;
  do {
    local_f0 = vsubpd_avx(*(undefined1 (*) [16])
                           ((long)&(pMVar3->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data + lVar7 + -0x10),
                          *(undefined1 (*) [16])
                           (local_100->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                           .m_storage.m_data.array);
    local_e0 = *(double *)
                ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar7) -
               (local_100->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
    local_d0[1] = (undefined1 *)0x3;
    dVar9 = local_f0._0_8_;
    dVar11 = local_f0._8_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
    ;
    auVar12 = vmovhpd_avx(auVar15,(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5]);
    dVar13 = local_e0 * auVar12._0_8_ +
             dVar9 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[0] +
             dVar11 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1];
    dVar14 = local_e0 * auVar12._8_8_ +
             dVar9 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[3] +
             dVar11 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4];
    pdVar1 = (double *)
             ((long)((local_120.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                    array + lVar7 + -0x10);
    dVar4 = *pdVar1;
    dVar5 = pdVar1[1];
    dVar11 = local_e0 *
             (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8] +
             dVar9 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[6] +
             dVar11 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7];
    dVar9 = *(double *)
             ((long)((local_120.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                    array + lVar7);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar9 * dVar9 + dVar4 * dVar4 + dVar5 * dVar5;
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar11 * dVar11 + dVar13 * dVar13 + dVar14 * dVar14;
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    dVar8 = dVar8 + (1.0 - (dVar11 * dVar9 + dVar13 * dVar4 + dVar14 * dVar5) /
                           (auVar10._0_8_ * auVar12._0_8_));
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x70);
  if (local_120.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_f8 = R;
    local_d8 = R;
    free((void *)local_120.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return dVar8;
}

Assistant:

double
opengv::absolute_pose::modules::gpnp_evaluate(
    const Eigen::Matrix<double,12,1> & solution,
    const points_t & c,
    translation_t & t,
    rotation_t & R )
{
  points_t ccam;
  for(size_t i = 0; i<4; i++)
    ccam.push_back(solution.block<3,1>(i*3,0));

  transformation_t transformation = math::arun_complete(c,ccam);
  t = transformation.col(3);
  R = transformation.block<3,3>(0,0);

  //transform world points into camera frame and compute the error
  double error = 0.0;
  for(size_t i = 0; i<4; i++)
  {
    point_t ccam_reprojected = R.transpose() * (c[i] - t);
    error +=
        1.0 -
        (ccam_reprojected.dot(ccam[i])/(ccam[i].norm()*ccam_reprojected.norm()));
  }

  return error;
}